

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xscroll.c
# Opt level: O0

int sbound(int lower,int value,int upper)

{
  int upper_local;
  int value_local;
  int lower_local;
  
  value_local = lower;
  if ((lower < value) && (value_local = value, upper <= value)) {
    value_local = upper;
  }
  return value_local;
}

Assistant:

static inline int sbound(int lower, int value, int upper)
{
  if (value <= lower)
    return (lower);
  else if (value >= upper)
    return (upper);
  else
    return (value);
}